

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# readptm.c
# Opt level: O0

int it_ptm_read_pattern(IT_PATTERN *pattern,DUMBFILE *f,uchar *buffer,int length)

{
  byte bVar1;
  uint uVar2;
  int iVar3;
  void *pvVar4;
  int in_ECX;
  long lVar5;
  long in_RDX;
  int iVar6;
  DUMBFILE *in_RSI;
  int *in_RDI;
  uchar n;
  uchar b_1;
  uchar b;
  uchar channel;
  IT_ENTRY *entry;
  int effectvalue;
  int effect;
  int bufpos;
  int buflen;
  undefined4 in_stack_ffffffffffffffb8;
  undefined1 in_stack_ffffffffffffffbc;
  undefined1 in_stack_ffffffffffffffbd;
  byte bVar7;
  byte in_stack_ffffffffffffffbe;
  byte in_stack_ffffffffffffffbf;
  IT_ENTRY *local_40;
  undefined4 in_stack_ffffffffffffffc8;
  undefined4 in_stack_ffffffffffffffcc;
  int32 n_00;
  int local_4;
  
  n_00 = 0;
  if (in_ECX == 0) {
    local_4 = -1;
  }
  else {
    *in_RDI = 0;
    in_RDI[1] = 0;
    iVar3 = 0;
    do {
      uVar2 = dumbfile_getc((DUMBFILE *)
                            CONCAT17(in_stack_ffffffffffffffbf,
                                     CONCAT16(in_stack_ffffffffffffffbe,
                                              CONCAT15(in_stack_ffffffffffffffbd,
                                                       CONCAT14(in_stack_ffffffffffffffbc,
                                                                in_stack_ffffffffffffffb8)))));
      iVar6 = iVar3 + 1;
      *(byte *)(in_RDX + iVar3) = (byte)uVar2;
      in_stack_ffffffffffffffbf = (byte)uVar2 & 0x1f;
      in_stack_ffffffffffffffbe = (byte)((int)(uVar2 & 0xff) >> 5);
      in_RDI[1] = in_RDI[1] + 1;
      if (in_stack_ffffffffffffffbe == 0) {
        iVar3 = *in_RDI;
        *in_RDI = iVar3 + 1;
        if (iVar3 + 1 == 0x40) goto LAB_0099f254;
        if (0xffff < iVar6) {
          return -1;
        }
      }
      else {
        if (0xffff < (int)(iVar6 + (uint)""[in_stack_ffffffffffffffbe])) {
          return -1;
        }
        dumbfile_getnc((char *)CONCAT44(in_ECX,iVar6),n_00,
                       (DUMBFILE *)CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8));
        iVar6 = (uint)""[in_stack_ffffffffffffffbe] + iVar6;
      }
      iVar3 = dumbfile_error(in_RSI);
      if (iVar3 != 0) {
        return -1;
      }
      iVar3 = iVar6;
    } while ((iVar6 < in_ECX) || (0x3f < *in_RDI));
    while (*in_RDI < 0x40) {
      if (0xffff < iVar6) {
        return -1;
      }
      *(undefined1 *)(in_RDX + iVar6) = 0;
      in_RDI[1] = in_RDI[1] + 1;
      *in_RDI = *in_RDI + 1;
      iVar6 = iVar6 + 1;
    }
LAB_0099f254:
    pvVar4 = malloc((long)in_RDI[1] * 7);
    *(void **)(in_RDI + 2) = pvVar4;
    if (*(long *)(in_RDI + 2) == 0) {
      local_4 = -1;
    }
    else {
      local_40 = *(IT_ENTRY **)(in_RDI + 2);
      while (iVar3 = n_00, iVar3 < iVar6) {
        n_00 = iVar3 + 1;
        bVar7 = *(byte *)(in_RDX + iVar3);
        if (bVar7 == 0) {
          local_40->channel = 0xff;
          local_40 = local_40 + 1;
        }
        else if ((bVar7 & 0xe0) != 0) {
          local_40->mask = '\0';
          local_40->channel = bVar7 & 0x1f;
          if ((bVar7 & 0x20) != 0) {
            bVar1 = *(byte *)(in_RDX + n_00);
            if ((bVar1 == 0xfe) || ((bVar1 != 0 && (bVar1 < 0x79)))) {
              if (bVar1 == 0xfe) {
                local_40->note = 0xfe;
              }
              else {
                local_40->note = bVar1 - 1;
              }
              local_40->mask = local_40->mask | 1;
            }
            n_00 = iVar3 + 3;
            local_40->instrument = *(uchar *)(in_RDX + (iVar3 + 2));
            if (local_40->instrument != '\0') {
              local_40->mask = local_40->mask | 2;
            }
          }
          if ((bVar7 & 0x40) != 0) {
            iVar3 = n_00 + 1;
            lVar5 = (long)n_00;
            n_00 = n_00 + 2;
            _dumb_it_ptm_convert_effect
                      ((uint)*(byte *)(in_RDX + lVar5),(uint)*(byte *)(in_RDX + iVar3),local_40);
          }
          iVar3 = n_00;
          if ((bVar7 & 0x80) != 0) {
            iVar3 = n_00 + 1;
            local_40->volpan = *(uchar *)(in_RDX + n_00);
            if (local_40->volpan < 0x41) {
              local_40->mask = local_40->mask | 4;
            }
          }
          local_40 = local_40 + 1;
          n_00 = iVar3;
        }
      }
      local_4 = 0;
    }
  }
  return local_4;
}

Assistant:

static int it_ptm_read_pattern(IT_PATTERN *pattern, DUMBFILE *f, unsigned char *buffer, int length)
{
	int buflen = 0;
	int bufpos = 0;
	int effect, effectvalue;

	IT_ENTRY *entry;

	unsigned char channel;

	if (!length)
		return -1;

	pattern->n_rows = 0;
	pattern->n_entries = 0;

	/* Read in the pattern data, little by little, and work out how many
	 * entries we need room for. Sorry, but this is just so funny...
	 */
	for (;;) {
		unsigned char b = buffer[buflen++] = dumbfile_getc(f);

#if 1
		static const unsigned char used[8] = {0, 2, 2, 4, 1, 3, 3, 5};
		channel = b & 31;
		b >>= 5;
		pattern->n_entries++;
		if (b) {
			if (buflen + used[b] >= 65536) return -1;
            dumbfile_getnc((char *)buffer + buflen, used[b], f);
			buflen += used[b];
		} else {
			/* End of row */
			if (++pattern->n_rows == 64) break;
			if (buflen >= 65536) return -1;
		}
#else
		if (b == 0) {
			/* End of row */
			pattern->n_entries++;
			if (++pattern->n_rows == 64) break;
			if (buflen >= 65536) return -1;
		} else {
			static const unsigned char used[8] = {0, 2, 2, 4, 1, 3, 3, 5};
			channel = b & 31;
			b >>= 5;
			if (b) {
				pattern->n_entries++;
				if (buflen + used[b] >= 65536) return -1;
				dumbfile_getnc(buffer + buflen, used[b], f);
				buflen += used[b];
			}
		}
#endif

		/* We have ensured that buflen < 65536 at this point, so it is safe
		 * to iterate and read at least one more byte without checking.
		 * However, now would be a good time to check for errors reading from
		 * the file.
		 */

		if (dumbfile_error(f))
			return -1;

		/* Great. We ran out of data, but there should be data for more rows.
		 * Fill the rest with null data...
		 */
		if (buflen >= length && pattern->n_rows < 64)
		{
			while (pattern->n_rows < 64)
			{
				if (buflen >= 65536) return -1;
				buffer[buflen++] = 0;
				pattern->n_entries++;
				pattern->n_rows++;
			}
			break;
		}
	}

	pattern->entry = malloc(pattern->n_entries * sizeof(*pattern->entry));

	if (!pattern->entry)
		return -1;

	entry = pattern->entry;

	while (bufpos < buflen) {
		unsigned char b = buffer[bufpos++];

		if (b == 0)
		{
			/* End of row */
			IT_SET_END_ROW(entry);
			entry++;
			continue;
		}

		channel = b & 31;

		if (b & 224) {
			entry->mask = 0;
			entry->channel = channel;

			if (b & 32) {
				unsigned char n = buffer[bufpos++];
				if (n == 254 || (n >= 1 && n <= 120)) {
					if (n == 254)
						entry->note = IT_NOTE_CUT;
					else
						entry->note = n - 1;
					entry->mask |= IT_ENTRY_NOTE;
				}

				entry->instrument = buffer[bufpos++];
				if (entry->instrument)
					entry->mask |= IT_ENTRY_INSTRUMENT;
			}

			if (b & 64) {
				effect = buffer[bufpos++];
				effectvalue = buffer[bufpos++];
				_dumb_it_ptm_convert_effect(effect, effectvalue, entry);
			}

			if (b & 128) {
				entry->volpan = buffer[bufpos++];
				if (entry->volpan <= 64)
					entry->mask |= IT_ENTRY_VOLPAN;
			}

			entry++;
		}
	}

	ASSERT(entry == pattern->entry + pattern->n_entries);

	return 0;
}